

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-uni.c
# Opt level: O0

void client_communicate(int descriptor,Arguments *args)

{
  ssize_t sVar1;
  long in_RSI;
  int in_EDI;
  uint64_t timestamp;
  bench_t local_18;
  long local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  while( true ) {
    if (*(int *)(local_10 + 4) < 1) {
      return;
    }
    local_18 = now();
    sVar1 = write(local_4,&local_18,8);
    if (sVar1 == -1) break;
    *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + -1;
  }
  throw((char *)0x1012a6);
}

Assistant:

void client_communicate(int descriptor, struct Arguments* args) {
	uint64_t timestamp;

	for (; args->count > 0; --args->count) {
		timestamp = now();

		// A write *adds* the value stored in the
		// eventfd to the value in the 8-byte buffer passed.
		// Here we send the current timestamp to the server
		if (write(descriptor, &timestamp, 8) == -1) {
			throw("Error writing to eventfd");
		}
	}
}